

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeDumper.cpp
# Opt level: O0

void Js::AsmJsByteCodeDumper::DumpConstants(AsmJsFunc *func,FunctionBody *body)

{
  code *pcVar1;
  bool bVar2;
  RegSlot RVar3;
  TypedRegisterAllocator *pTVar4;
  RegisterSpace *this;
  long lVar5;
  undefined4 *puVar6;
  byte *tableOffseted;
  uint offset;
  uint constCount;
  Types type;
  int i;
  TypedConstSourcesInfo constSrcInfos;
  byte *table;
  FunctionBody *body_local;
  AsmJsFunc *func_local;
  
  constSrcInfos._16_8_ = FunctionBody::GetConstTable(body);
  pTVar4 = AsmJsFunc::GetTypedRegisterAllocator(func);
  WAsmJs::TypedRegisterAllocator::GetConstSourceInfos((TypedConstSourcesInfo *)&type,pTVar4);
  constCount = 0;
  do {
    if (4 < (int)constCount) {
      return;
    }
    pTVar4 = AsmJsFunc::GetTypedRegisterAllocator(func);
    bVar2 = WAsmJs::TypedRegisterAllocator::IsTypeExcluded(pTVar4,constCount);
    if (!bVar2) {
      pTVar4 = AsmJsFunc::GetTypedRegisterAllocator(func);
      this = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(pTVar4,constCount);
      RVar3 = WAsmJs::RegisterSpace::GetConstCount(this);
      if (RVar3 != 0) {
        lVar5 = constSrcInfos._16_8_ + (ulong)(&type)[(int)constCount];
        switch(constCount) {
        case 0:
          PrintTypedConstants<int,Js::AsmJsByteCodeDumper::DumpConstants(Js::AsmJsFunc*,Js::FunctionBody*)::__0>
                    (lVar5,constCount,RVar3);
          break;
        case 1:
          PrintTypedConstants<long,Js::AsmJsByteCodeDumper::DumpConstants(Js::AsmJsFunc*,Js::FunctionBody*)::__1>
                    (lVar5,constCount,RVar3);
          break;
        case 2:
          PrintTypedConstants<float,Js::AsmJsByteCodeDumper::DumpConstants(Js::AsmJsFunc*,Js::FunctionBody*)::__2>
                    (lVar5,constCount,RVar3);
          break;
        case 3:
          PrintTypedConstants<double,Js::AsmJsByteCodeDumper::DumpConstants(Js::AsmJsFunc*,Js::FunctionBody*)::__3>
                    (lVar5,constCount,RVar3);
          break;
        case 4:
          PrintTypedConstants<_SIMDValue,Js::AsmJsByteCodeDumper::DumpConstants(Js::AsmJsFunc*,Js::FunctionBody*)::__4>
                    (lVar5,constCount,RVar3);
          break;
        default:
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeDumper.cpp"
                                      ,0xfd,"(false)","false");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
      }
      Output::Print(L"\n");
    }
    constCount = constCount + 1;
  } while( true );
}

Assistant:

void AsmJsByteCodeDumper::DumpConstants(AsmJsFunc* func, FunctionBody* body)
    {
        byte* table = (byte*)body->GetConstTable();
        auto constSrcInfos = func->GetTypedRegisterAllocator().GetConstSourceInfos();
        for (int i = 0; i < WAsmJs::LIMIT; ++i)
        {
            WAsmJs::Types type = (WAsmJs::Types)i;
            if (func->GetTypedRegisterAllocator().IsTypeExcluded(type))
            {
                continue;
            }
            uint constCount = func->GetTypedRegisterAllocator().GetRegisterSpace(type)->GetConstCount();
            if (constCount > 0)
            {
                uint offset = constSrcInfos.srcByteOffsets[i];
                byte* tableOffseted = table + offset;
                switch (type)
                {
                case WAsmJs::INT32:   PrintTypedConstants<int>(tableOffseted, type, constCount, [](int v) {Output::Print(_u("%d"), v);}); break;
                case WAsmJs::INT64:   PrintTypedConstants<int64>(tableOffseted, type, constCount, [](int64 v) {Output::Print(_u("%lld"), v);}); break;
                case WAsmJs::FLOAT32: PrintTypedConstants<float>(tableOffseted, type, constCount, [](float v) {Output::Print(_u("%.4f"), v);}); break;
                case WAsmJs::FLOAT64: PrintTypedConstants<double>(tableOffseted, type, constCount, [](double v) {Output::Print(_u("%.4f"), v);}); break;
                case WAsmJs::SIMD:    PrintTypedConstants<AsmJsSIMDValue>(tableOffseted, type, constCount, [](AsmJsSIMDValue v) {
                    Output::Print(_u("\n       I32(%d, %d, %d, %d),"), v.i32[SIMD_X], v.i32[SIMD_Y], v.i32[SIMD_Z], v.i32[SIMD_W]);
                    Output::Print(_u("\n       F32(%.4f, %.4f, %.4f, %.4f),"), v.f32[SIMD_X], v.f32[SIMD_Y], v.f32[SIMD_Z], v.f32[SIMD_W]);
                    Output::Print(_u("\n       D64(%.4f, %.4f),"), v.f64[SIMD_X], v.f64[SIMD_Y]);
                    Output::Print(_u("\n       I8(%d, %d, %d, %d, %d, %d, %d, %d, %d, %d, %d, %d, %d, %d, %d, %d)"),
                                  v.i8[0], v.i8[1], v.i8[2], v.i8[3], v.i8[4], v.i8[5], v.i8[6], v.i8[7],
                                  v.i8[8], v.i8[9], v.i8[10], v.i8[11], v.i8[12], v.i8[13], v.i8[14], v.i8[15]);
                    });
                    break;
                default:
                    Assert(false);
                    break;
                }
            }
            Output::Print(_u("\n"));
        }
    }